

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_algo_struct.c
# Opt level: O0

void fast_gmm_report(fast_gmm_t *f)

{
  fast_gmm_t *f_local;
  
  if (f != (fast_gmm_t *)0x0) {
    err_msg(ERR_INFO,(char *)0x0,0,"Initialization of fast_gmm_t, report:\n");
    err_msg(ERR_INFO,(char *)0x0,0,"Parameters used in Fast GMM computation:\n");
    err_msg(ERR_INFO,(char *)0x0,0,
            "   Frame-level: Down Sampling Ratio %d, Conditional Down Sampling? %d, Distance-based Down Sampling? %d\n"
            ,(ulong)(uint)f->downs->ds_ratio,(ulong)(uint)f->downs->cond_ds,f->downs->dist_ds);
    err_msg(ERR_INFO,(char *)0x0,0,"     GMM-level: CI phone beam %d. MAX CD %d\n",
            (ulong)(uint)f->gmms->ci_pbeam,(ulong)(uint)f->gmms->max_cd);
    err_msg(ERR_INFO,(char *)0x0,0,
            "Gaussian-level: GS map would be used for Gaussian Selection? =%d, SVQ would be used as Gaussian Score? =%d SubVQ Beam %d\n"
            ,(ulong)(uint)f->gs4gs,(ulong)(uint)f->svq4svq,f->gaus->subvqbeam);
    err_msg(ERR_INFO,(char *)0x0,0,"\n");
    return;
  }
  __assert_fail("f",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/fast_algo_struct.c"
                ,0x1ef,"void fast_gmm_report(fast_gmm_t *)");
}

Assistant:

void
fast_gmm_report(fast_gmm_t * f)
{
    assert(f);
    E_INFO_NOFN("Initialization of fast_gmm_t, report:\n");
    E_INFO_NOFN("Parameters used in Fast GMM computation:\n");
    E_INFO_NOFN
        ("   Frame-level: Down Sampling Ratio %d, Conditional Down Sampling? %d, Distance-based Down Sampling? %d\n",
         f->downs->ds_ratio, f->downs->cond_ds, f->downs->dist_ds);
    E_INFO_NOFN("     GMM-level: CI phone beam %d. MAX CD %d\n",
                f->gmms->ci_pbeam, f->gmms->max_cd);
    E_INFO_NOFN
        ("Gaussian-level: GS map would be used for Gaussian Selection? =%d, SVQ would be used as Gaussian Score? =%d SubVQ Beam %d\n",
         f->gs4gs, f->svq4svq, f->gaus->subvqbeam);

    E_INFO_NOFN("\n");

}